

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O3

void __thiscall YdiskRestClient::downloadFile(YdiskRestClient *this,string *path,ofstream *ofstream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Type TVar3;
  Json *pJVar4;
  runtime_error *this_00;
  char *this_01;
  Client *this_02;
  YdiskRestClient *this_03;
  Json json;
  string error;
  string url;
  shared_ptr<httplib::Response> r;
  Json local_128;
  string local_118;
  string local_f8;
  Headers *local_d8;
  long local_d0;
  undefined1 local_c8 [24];
  _Base_ptr local_b0;
  undefined1 local_a8 [16];
  string local_98;
  undefined1 local_78 [40];
  _Base_ptr p_Stack_50;
  _Base_ptr local_48;
  size_t sStack_40;
  
  this_01 = "/v1/disk/resources/download?path=";
  local_d8 = (Headers *)local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"/v1/disk/resources/download?path=","");
  url_encode(&local_118,(YdiskRestClient *)this_01,path);
  std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_118._M_dataplus._M_p);
  paVar1 = &local_118.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  local_78._32_8_ = 0;
  p_Stack_50 = (_Base_ptr)0x0;
  local_48 = (_Base_ptr)0x0;
  sStack_40 = 0;
  this_02 = (Client *)local_a8;
  httplib::Client::Get(this_02,(char *)this->http_client,local_d8,(Progress *)&this->headers);
  if (local_48 != (_Base_ptr)0x0) {
    this_02 = (Client *)(local_78 + 0x20);
    (*(code *)local_48)(this_02,this_02,3);
  }
  if (((Response *)local_a8._0_8_ == (Response *)0x0) || (*(int *)(local_a8._0_8_ + 0x20) != 200)) {
    throw_response_error((YdiskRestClient *)this_02,(Response *)local_a8._0_8_);
  }
  else {
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    local_118._M_dataplus._M_p = (pointer)paVar1;
    json11::Json::parse(&local_128,(string *)(local_a8._0_8_ + 0x58),&local_118,STANDARD);
    local_c8._16_8_ =
         local_128.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_b0 = (_Base_ptr)
               local_128.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (local_128.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_128.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_128.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_128.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_128.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    this_03 = (YdiskRestClient *)local_78;
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this_03,local_118._M_dataplus._M_p,
               local_118._M_dataplus._M_p + local_118._M_string_length);
    check_parsing_result(this_03,(Json *)(local_c8 + 0x10),(string *)local_78);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_b0 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0);
    }
    paVar2 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"href","");
    pJVar4 = json11::Json::operator[](&local_128,&local_f8);
    TVar3 = json11::Json::type(pJVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (TVar3 == STRING) {
      local_f8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"href","");
      pJVar4 = json11::Json::operator[](&local_128,&local_f8);
      json11::Json::string_value_abi_cxx11_(pJVar4);
      std::__cxx11::string::_M_assign((string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_128.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      local_98._M_dataplus._M_p = local_a8 + 0x20;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_a8 + 0x10),local_d8,&(local_d8->_M_t)._M_impl.field_0x0 + local_d0
                );
      _do_download(this,(string *)(local_a8 + 0x10),ofstream);
      if (local_98._M_dataplus._M_p != local_a8 + 0x20) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._0_8_ + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
      if (local_d8 != (Headers *)local_c8) {
        operator_delete(local_d8,local_c8._0_8_ + 1);
      }
      return;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Wrong json format");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void YdiskRestClient::downloadFile(std::string path, std::ofstream &ofstream)
{
    std::string url("/v1/disk/resources/download?path=");
    url += url_encode(path);

    //Get download link
    auto r = http_client->Get(url.c_str(), headers);
    if(r.get() && r->status==200){
        std::string error;
        const auto json = Json::parse(r->body, error);
        check_parsing_result(json, error);
        if(!json["href"].is_string())
            throw std::runtime_error("Wrong json format");

        url = json["href"].string_value();
    } else {
        throw_response_error(r.get());
    }

    _do_download(url, ofstream);

}